

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(char *name,size_t name_len,LIBSSH2_COMMON_METHOD **methodlist)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  LIBSSH2_COMMON_METHOD *pLVar3;
  LIBSSH2_COMMON_METHOD **ppLVar4;
  
  pLVar3 = *methodlist;
  if (pLVar3 != (LIBSSH2_COMMON_METHOD *)0x0) {
    ppLVar4 = methodlist + 1;
    do {
      __s = pLVar3->name;
      sVar2 = strlen(__s);
      if ((sVar2 == name_len) && (iVar1 = strncmp(__s,name,name_len), iVar1 == 0)) {
        return pLVar3;
      }
      pLVar3 = *ppLVar4;
      ppLVar4 = ppLVar4 + 1;
    } while (pLVar3 != (LIBSSH2_COMMON_METHOD *)0x0);
  }
  return (LIBSSH2_COMMON_METHOD *)0x0;
}

Assistant:

static const LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(const char *name, size_t name_len,
                       const LIBSSH2_COMMON_METHOD ** methodlist)
{
    while (*methodlist) {
        if ((strlen((*methodlist)->name) == name_len) &&
            (strncmp((*methodlist)->name, name, name_len) == 0)) {
            return *methodlist;
        }
        methodlist++;
    }
    return NULL;
}